

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O0

PulseStyleSymbol *
slang::ast::PulseStyleSymbol::fromSyntax(Scope *parent,PulseStyleDeclarationSyntax *syntax)

{
  SourceLocation this;
  PulseStyleSymbol *this_00;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  Token TVar1;
  PulseStyleSymbol *result;
  Compilation *comp;
  PulseStyleKind pulseStyleKind;
  
  SemanticFacts::getPulseStyleKind(*(TokenKind *)&in_RSI[3].parent);
  Scope::getCompilation(in_RDI);
  TVar1 = slang::syntax::SyntaxNode::getFirstToken(in_RSI);
  this = parsing::Token::location((Token *)&stack0xffffffffffffffc0);
  this_00 = BumpAllocator::
            emplace<slang::ast::PulseStyleSymbol,slang::SourceLocation,slang::ast::PulseStyleKind&>
                      ((BumpAllocator *)this,(SourceLocation *)TVar1.info,TVar1._0_8_);
  Symbol::setSyntax(&this_00->super_Symbol,in_RSI);
  return this_00;
}

Assistant:

PulseStyleSymbol& PulseStyleSymbol::fromSyntax(const Scope& parent,
                                               const PulseStyleDeclarationSyntax& syntax) {
    auto pulseStyleKind = SemanticFacts::getPulseStyleKind(syntax.keyword.kind);

    auto& comp = parent.getCompilation();
    auto result = comp.emplace<PulseStyleSymbol>(syntax.getFirstToken().location(), pulseStyleKind);
    result->setSyntax(syntax);
    return *result;
}